

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void CConsole::ConToggleStroke(IResult *pResult,void *pUser)

{
  long lVar1;
  int iVar2;
  CCommand *pCVar3;
  undefined8 uVar4;
  CConsole *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int Val;
  CCommand *pCommand;
  CConsole *pConsole;
  void *pUserData;
  FCommandCallback pfnCallback;
  char aBuf [128];
  undefined8 in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *pcVar5;
  CConsole *in_stack_ffffffffffffff28;
  uint local_cc;
  void *local_98;
  FCommandCallback local_90;
  char local_88 [80];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_88,0,0x80);
  (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  pCVar3 = FindCommand(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                       (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  if (pCVar3 == (CCommand *)0x0) {
    uVar4 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    str_format(local_88,0x80,"No such command: \'%s\'.",uVar4);
  }
  else {
    local_90 = pCVar3->m_pfnCallback;
    local_98 = pCVar3->m_pUserData;
    TraverseChain(in_RSI,&local_90,&local_98);
    if (local_90 == IntVariableCommand) {
      iVar2 = (**(code **)(*in_RDI + 0x10))(in_RDI,0);
      if (iVar2 == 0) {
        local_cc = (**(code **)(*in_RDI + 0x10))(in_RDI,3);
      }
      else {
        local_cc = (**(code **)(*in_RDI + 0x10))(in_RDI,2);
      }
      pcVar5 = local_88;
      uVar4 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
      str_format(pcVar5,0x80,"%s %i",uVar4,(ulong)local_cc);
      (*(in_RSI->super_IConsole).super_IInterface._vptr_IInterface[0x13])(in_RSI,local_88);
      local_88[0] = '\0';
    }
    else {
      pcVar5 = local_88;
      uVar4 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
      str_format(pcVar5,0x80,"Invalid command: \'%s\'.",uVar4);
    }
  }
  if (local_88[0] != '\0') {
    (*(in_RSI->super_IConsole).super_IInterface._vptr_IInterface[0x19])(in_RSI,0,"console",local_88)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConsole::ConToggleStroke(IConsole::IResult *pResult, void *pUser)
{
	CConsole *pConsole = static_cast<CConsole *>(pUser);
	char aBuf[128] = {0};
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(1), pConsole->m_FlagMask);
	if(pCommand)
	{
		FCommandCallback pfnCallback = pCommand->m_pfnCallback;
		void *pUserData = pCommand->m_pUserData;
		pConsole->TraverseChain(&pfnCallback, &pUserData);
		if(pfnCallback == IntVariableCommand)
		{
			int Val = pResult->GetInteger(0)==0 ? pResult->GetInteger(3) : pResult->GetInteger(2);
			str_format(aBuf, sizeof(aBuf), "%s %i", pResult->GetString(1), Val);
			pConsole->ExecuteLine(aBuf);
			aBuf[0] = 0;
		}
		else
			str_format(aBuf, sizeof(aBuf), "Invalid command: '%s'.", pResult->GetString(1));
	}
	else
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(1));

	if(aBuf[0])
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}